

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

QString * buttonDefaultText(int wstyle,int which,QWizardPrivate *wizardPrivate)

{
  char *s;
  QWizardPrivate *in_RCX;
  uint in_EDX;
  int in_ESI;
  QString *in_RDI;
  bool bVar1;
  bool macStyle;
  int iVar2;
  QString *c;
  
  bVar1 = in_ESI != 2;
  s = (char *)(ulong)in_EDX;
  iVar2 = (int)((ulong)in_RDI >> 0x20);
  switch(s) {
  case (char *)0x0:
    if (bVar1) {
      QWizard::tr(s,(char *)in_RDI,iVar2);
    }
    else {
      QWizard::tr(s,(char *)in_RDI,iVar2);
    }
    break;
  case (char *)0x1:
    if (bVar1) {
      c = in_RDI;
      bVar1 = QWizardPrivate::isVistaThemeEnabled(in_RCX);
      iVar2 = (int)((ulong)in_RDI >> 0x20);
      if (bVar1) {
        QWizard::tr(s,(char *)c,iVar2);
        in_RDI = c;
      }
      else {
        QWizard::tr(s,(char *)c,iVar2);
        in_RDI = c;
      }
    }
    else {
      QWizard::tr(s,(char *)in_RDI,iVar2);
    }
    break;
  case (char *)0x2:
    QWizard::tr(s,(char *)in_RDI,iVar2);
    break;
  case (char *)0x3:
    if (bVar1) {
      QWizard::tr(s,(char *)in_RDI,iVar2);
    }
    else {
      QWizard::tr(s,(char *)in_RDI,iVar2);
    }
    break;
  case (char *)0x4:
    QWizard::tr(s,(char *)in_RDI,iVar2);
    break;
  case (char *)0x5:
    if (bVar1) {
      QWizard::tr(s,(char *)in_RDI,iVar2);
    }
    else {
      QWizard::tr(s,(char *)in_RDI,iVar2);
    }
    break;
  default:
    QString::QString((QString *)0x7b9941);
  }
  return in_RDI;
}

Assistant:

static QString buttonDefaultText(int wstyle, int which, const QWizardPrivate *wizardPrivate)
{
#if !QT_CONFIG(style_windowsvista)
    Q_UNUSED(wizardPrivate);
#endif
    const bool macStyle = (wstyle == QWizard::MacStyle);
    switch (which) {
    case QWizard::BackButton:
        return macStyle ? QWizard::tr("Go Back") : QWizard::tr("< &Back");
    case QWizard::NextButton:
        if (macStyle)
            return QWizard::tr("Continue");
        else
            return wizardPrivate->isVistaThemeEnabled()
                ? QWizard::tr("&Next") : QWizard::tr("&Next >");
    case QWizard::CommitButton:
        return QWizard::tr("Commit");
    case QWizard::FinishButton:
        return macStyle ? QWizard::tr("Done") : QWizard::tr("&Finish");
    case QWizard::CancelButton:
        return QWizard::tr("Cancel");
    case QWizard::HelpButton:
        return macStyle ? QWizard::tr("Help") : QWizard::tr("&Help");
    default:
        return QString();
    }
}